

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int lyd_print_file(FILE *f,lyd_node *root,LYD_FORMAT format,int options)

{
  int iVar1;
  undefined1 auStack_58 [8];
  lyout out;
  
  if (f == (FILE *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_print_file");
    iVar1 = 1;
  }
  else {
    out.buf_len = 0;
    out.buf_size = 0;
    out.method.mem.size = 0;
    out.buffered = (char *)0x0;
    out.method.f = (FILE *)0x0;
    out.method.mem.len = 0;
    auStack_58 = (undefined1  [8])0x1;
    out._0_8_ = f;
    iVar1 = lyd_print_((lyout *)auStack_58,root,format,options);
    free((void *)out.method.mem.size);
  }
  return iVar1;
}

Assistant:

API int
lyd_print_file(FILE *f, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    int r;
    struct lyout out;

    if (!f) {
        LOGARG;
        return EXIT_FAILURE;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_STREAM;
    out.method.f = f;

    r = lyd_print_(&out, root, format, options);

    free(out.buffered);
    return r;
}